

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat_pixel_resize.cpp
# Opt level: O0

void ncnn::resize_bilinear_c4
               (uchar *src,int srcw,int srch,int srcstride,uchar *dst,int w,int h,int stride)

{
  short sVar1;
  short sVar2;
  int iVar3;
  undefined1 auVar4 [16];
  ulong uVar5;
  int *piVar6;
  byte *pbVar7;
  byte *pbVar8;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  long in_R8;
  int in_R9D;
  double dVar9;
  int in_stack_00000008;
  int in_stack_00000010;
  int remain;
  int nn;
  uchar *Dp;
  short *rows1p;
  short *rows0p;
  short b1_1;
  short b0_1;
  uchar *S1p_1;
  uchar *S0p;
  short a1_2;
  short a0_2;
  int sx_2;
  int dx_2;
  short *rows1p_2;
  short *rows0p_1;
  short *ialphap_1;
  uchar *S1_1;
  uchar *S0;
  uchar *S1p;
  short a1_1;
  short a0_1;
  int sx_1;
  int dx_1;
  short *rows1p_1;
  short *ialphap;
  uchar *S1;
  short *rows0_old;
  int sy_1;
  int dy_1;
  int prev_sy1;
  short *rows1;
  short *rows0;
  Mat rowsbuf1;
  Mat rowsbuf0;
  float b1;
  float b0;
  int dy;
  float a1;
  float a0;
  int dx;
  int sy;
  int sx;
  float fy;
  float fx;
  short *ibeta;
  short *ialpha;
  int *yofs;
  int *xofs;
  int *buf;
  double scale_y;
  double scale_x;
  int INTER_RESIZE_COEF_SCALE;
  int INTER_RESIZE_COEF_BITS;
  Allocator *in_stack_fffffffffffffdc8;
  size_t in_stack_fffffffffffffdd0;
  int iVar10;
  Mat *this;
  int local_218;
  undefined1 *local_210;
  short *local_208;
  short *local_200;
  int local_1d4;
  short *local_1d0;
  short *local_1c8;
  short *local_1c0;
  int local_194;
  short *local_190;
  short *local_188;
  int local_168;
  int local_164;
  short *local_160;
  short *local_158;
  short *local_140;
  short *local_100;
  int local_c0 [3];
  int local_b4 [3];
  float local_a8;
  float local_a4;
  int local_a0;
  int local_9c [3];
  int local_90 [3];
  float local_84;
  float local_80;
  int local_7c;
  int local_78;
  int local_74;
  float local_70;
  float local_6c;
  short *local_68;
  short *local_60;
  void *local_58;
  void *local_50;
  void *local_48;
  double local_40;
  double local_38;
  undefined4 local_2c;
  undefined4 local_28;
  int local_24;
  long local_20;
  int local_14;
  int local_10;
  int local_c;
  long local_8;
  
  local_28 = 0xb;
  local_2c = 0x800;
  local_38 = (double)in_ESI / (double)in_R9D;
  local_40 = (double)in_EDX / (double)in_stack_00000008;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = (long)(in_R9D * 2 + in_stack_00000008 * 2);
  uVar5 = SUB168(auVar4 * ZEXT816(4),0);
  if (SUB168(auVar4 * ZEXT816(4),8) != 0) {
    uVar5 = 0xffffffffffffffff;
  }
  local_24 = in_R9D;
  local_20 = in_R8;
  local_14 = in_ECX;
  local_10 = in_EDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  local_50 = operator_new__(uVar5);
  local_58 = (void *)((long)local_50 + (long)local_24 * 4);
  local_60 = (short *)((long)local_50 + (long)in_stack_00000008 * 4 + (long)local_24 * 4);
  local_68 = (short *)((long)local_50 +
                      (long)local_24 * 4 + (long)in_stack_00000008 * 4 + (long)local_24 * 4);
  local_48 = local_50;
  for (local_7c = 0; local_7c < local_24; local_7c = local_7c + 1) {
    local_6c = (float)(((double)local_7c + 0.5) * local_38 - 0.5);
    dVar9 = std::floor((double)(ulong)(uint)local_6c);
    local_74 = (int)SUB84(dVar9,0);
    local_6c = local_6c - (float)local_74;
    if (local_74 < 0) {
      local_74 = 0;
      local_6c = 0.0;
    }
    if (local_c + -1 <= local_74) {
      local_74 = local_c + -2;
      local_6c = 1.0;
    }
    *(int *)((long)local_50 + (long)local_7c * 4) = local_74 << 2;
    local_80 = (1.0 - local_6c) * 2048.0;
    local_84 = local_6c * 2048.0;
    local_90[2] = (int)(local_80 +
                       (float)(~-(uint)(0.0 <= local_80) & 0xbf000000 |
                              -(uint)(0.0 <= local_80) & 0x3f000000));
    local_90[1] = 0xffff8000;
    piVar6 = std::max<int>(local_90 + 2,local_90 + 1);
    local_90[0] = 0x7fff;
    piVar6 = std::min<int>(piVar6,local_90);
    local_60[local_7c << 1] = (short)*piVar6;
    local_9c[2] = (int)(local_84 +
                       (float)(~-(uint)(0.0 <= local_84) & 0xbf000000 |
                              -(uint)(0.0 <= local_84) & 0x3f000000));
    local_9c[1] = 0xffff8000;
    piVar6 = std::max<int>(local_9c + 2,local_9c + 1);
    local_9c[0] = 0x7fff;
    piVar6 = std::min<int>(piVar6,local_9c);
    local_60[local_7c * 2 + 1] = (short)*piVar6;
  }
  for (local_a0 = 0; local_a0 < in_stack_00000008; local_a0 = local_a0 + 1) {
    local_70 = (float)(((double)local_a0 + 0.5) * local_40 - 0.5);
    dVar9 = std::floor((double)(ulong)(uint)local_70);
    local_78 = (int)SUB84(dVar9,0);
    local_70 = local_70 - (float)local_78;
    if (local_78 < 0) {
      local_78 = 0;
      local_70 = 0.0;
    }
    if (local_10 + -1 <= local_78) {
      local_78 = local_10 + -2;
      local_70 = 1.0;
    }
    *(int *)((long)local_58 + (long)local_a0 * 4) = local_78;
    local_a4 = (1.0 - local_70) * 2048.0;
    local_a8 = local_70 * 2048.0;
    local_b4[2] = (int)(local_a4 +
                       (float)(~-(uint)(0.0 <= local_a4) & 0xbf000000 |
                              -(uint)(0.0 <= local_a4) & 0x3f000000));
    local_b4[1] = 0xffff8000;
    piVar6 = std::max<int>(local_b4 + 2,local_b4 + 1);
    local_b4[0] = 0x7fff;
    piVar6 = std::min<int>(piVar6,local_b4);
    local_68[local_a0 << 1] = (short)*piVar6;
    local_c0[2] = (int)(local_a8 +
                       (float)(~-(uint)(0.0 <= local_a8) & 0xbf000000 |
                              -(uint)(0.0 <= local_a8) & 0x3f000000));
    local_c0[1] = 0xffff8000;
    piVar6 = std::max<int>(local_c0 + 2,local_c0 + 1);
    local_c0[0] = 0x7fff;
    piVar6 = std::min<int>(piVar6,local_c0);
    local_68[local_a0 * 2 + 1] = (short)*piVar6;
  }
  this = (Mat *)0x0;
  iVar10 = 0;
  Mat::Mat((Mat *)0x0,0,in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
  Mat::Mat(this,iVar10,in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
  local_158 = local_100;
  local_160 = local_140;
  local_164 = -2;
  for (local_168 = 0; local_190 = local_158, local_168 < in_stack_00000008;
      local_168 = local_168 + 1) {
    iVar10 = *(int *)((long)local_58 + (long)local_168 * 4);
    if (iVar10 != local_164) {
      if (iVar10 == local_164 + 4) {
        local_158 = local_160;
        local_160 = local_190;
        local_188 = local_60;
        for (local_194 = 0; local_194 < local_24; local_194 = local_194 + 1) {
          sVar1 = *local_188;
          sVar2 = local_188[1];
          pbVar7 = (byte *)(local_8 + local_14 * (iVar10 + 1) +
                           (long)*(int *)((long)local_50 + (long)local_194 * 4));
          *local_190 = (short)((int)((uint)*pbVar7 * (int)sVar1 + (uint)pbVar7[4] * (int)sVar2) >> 4
                              );
          local_190[1] = (short)((int)((uint)pbVar7[1] * (int)sVar1 + (uint)pbVar7[5] * (int)sVar2)
                                >> 4);
          local_190[2] = (short)((int)((uint)pbVar7[2] * (int)sVar1 + (uint)pbVar7[6] * (int)sVar2)
                                >> 4);
          local_190[3] = (short)((int)((uint)pbVar7[3] * (int)sVar1 + (uint)pbVar7[7] * (int)sVar2)
                                >> 4);
          local_188 = local_188 + 2;
          local_190 = local_190 + 4;
        }
      }
      else {
        local_1c0 = local_60;
        local_1c8 = local_158;
        local_1d0 = local_160;
        for (local_1d4 = 0; local_1d4 < local_24; local_1d4 = local_1d4 + 1) {
          iVar3 = *(int *)((long)local_50 + (long)local_1d4 * 4);
          sVar1 = *local_1c0;
          sVar2 = local_1c0[1];
          pbVar7 = (byte *)(local_8 + local_14 * iVar10 + (long)iVar3);
          pbVar8 = (byte *)(local_8 + local_14 * (iVar10 + 1) + (long)iVar3);
          *local_1c8 = (short)((int)((uint)*pbVar7 * (int)sVar1 + (uint)pbVar7[4] * (int)sVar2) >> 4
                              );
          local_1c8[1] = (short)((int)((uint)pbVar7[1] * (int)sVar1 + (uint)pbVar7[5] * (int)sVar2)
                                >> 4);
          local_1c8[2] = (short)((int)((uint)pbVar7[2] * (int)sVar1 + (uint)pbVar7[6] * (int)sVar2)
                                >> 4);
          local_1c8[3] = (short)((int)((uint)pbVar7[3] * (int)sVar1 + (uint)pbVar7[7] * (int)sVar2)
                                >> 4);
          *local_1d0 = (short)((int)((uint)*pbVar8 * (int)sVar1 + (uint)pbVar8[4] * (int)sVar2) >> 4
                              );
          local_1d0[1] = (short)((int)((uint)pbVar8[1] * (int)sVar1 + (uint)pbVar8[5] * (int)sVar2)
                                >> 4);
          local_1d0[2] = (short)((int)((uint)pbVar8[2] * (int)sVar1 + (uint)pbVar8[6] * (int)sVar2)
                                >> 4);
          local_1d0[3] = (short)((int)((uint)pbVar8[3] * (int)sVar1 + (uint)pbVar8[7] * (int)sVar2)
                                >> 4);
          local_1c0 = local_1c0 + 2;
          local_1c8 = local_1c8 + 4;
          local_1d0 = local_1d0 + 4;
        }
      }
    }
    sVar1 = *local_68;
    sVar2 = local_68[1];
    local_200 = local_158;
    local_208 = local_160;
    local_210 = (undefined1 *)(local_20 + in_stack_00000010 * local_168);
    for (local_218 = local_24 * 4; local_218 != 0; local_218 = local_218 + -1) {
      *local_210 = (char)((int)(short)((uint)((int)sVar1 * (int)*local_200) >> 0x10) +
                          (int)(short)((uint)((int)sVar2 * (int)*local_208) >> 0x10) + 2 >> 2);
      local_210 = local_210 + 1;
      local_208 = local_208 + 1;
      local_200 = local_200 + 1;
    }
    local_68 = local_68 + 2;
    local_164 = iVar10;
  }
  if (local_48 != (void *)0x0) {
    operator_delete__(local_48);
  }
  Mat::~Mat((Mat *)0x16543e);
  Mat::~Mat((Mat *)0x16544b);
  return;
}

Assistant:

void resize_bilinear_c4(const unsigned char* src, int srcw, int srch, int srcstride, unsigned char* dst, int w, int h, int stride)
{
    const int INTER_RESIZE_COEF_BITS=11;
    const int INTER_RESIZE_COEF_SCALE=1 << INTER_RESIZE_COEF_BITS;
//     const int ONE=INTER_RESIZE_COEF_SCALE;

    double scale_x = (double)srcw / w;
    double scale_y = (double)srch / h;

    int* buf = new int[w + h + w + h];

    int* xofs = buf;//new int[w];
    int* yofs = buf + w;//new int[h];

    short* ialpha = (short*)(buf + w + h);//new short[w * 2];
    short* ibeta = (short*)(buf + w + h + w);//new short[h * 2];

    float fx;
    float fy;
    int sx;
    int sy;

#define SATURATE_CAST_SHORT(X) (short)::std::min(::std::max((int)(X + (X >= 0.f ? 0.5f : -0.5f)), SHRT_MIN), SHRT_MAX);

    for (int dx = 0; dx < w; dx++)
    {
        fx = (float)((dx + 0.5) * scale_x - 0.5);
        sx = static_cast<int>(floor(fx));
        fx -= sx;

        if (sx < 0)
        {
            sx = 0;
            fx = 0.f;
        }
        if (sx >= srcw - 1)
        {
            sx = srcw - 2;
            fx = 1.f;
        }

        xofs[dx] = sx*4;

        float a0 = (1.f - fx) * INTER_RESIZE_COEF_SCALE;
        float a1 =        fx  * INTER_RESIZE_COEF_SCALE;

        ialpha[dx*2    ] = SATURATE_CAST_SHORT(a0);
        ialpha[dx*2 + 1] = SATURATE_CAST_SHORT(a1);
    }

    for (int dy = 0; dy < h; dy++)
    {
        fy = (float)((dy + 0.5) * scale_y - 0.5);
        sy = static_cast<int>(floor(fy));
        fy -= sy;

        if (sy < 0)
        {
            sy = 0;
            fy = 0.f;
        }
        if (sy >= srch - 1)
        {
            sy = srch - 2;
            fy = 1.f;
        }

        yofs[dy] = sy;

        float b0 = (1.f - fy) * INTER_RESIZE_COEF_SCALE;
        float b1 =        fy  * INTER_RESIZE_COEF_SCALE;

        ibeta[dy*2    ] = SATURATE_CAST_SHORT(b0);
        ibeta[dy*2 + 1] = SATURATE_CAST_SHORT(b1);
    }

#undef SATURATE_CAST_SHORT

    // loop body
    Mat rowsbuf0(w*4, (size_t)2u);
    Mat rowsbuf1(w*4, (size_t)2u);
    short* rows0 = (short*)rowsbuf0.data;
    short* rows1 = (short*)rowsbuf1.data;

    int prev_sy1 = -2;

    for (int dy = 0; dy < h; dy++ )
    {
        int sy = yofs[dy];

        if (sy == prev_sy1)
        {
            // reuse all rows
        }
        else if (sy == prev_sy1 + 4)
        {
            // hresize one row
            short* rows0_old = rows0;
            rows0 = rows1;
            rows1 = rows0_old;
            const unsigned char *S1 = src + srcstride * (sy+1);

            const short* ialphap = ialpha;
            short* rows1p = rows1;
            for ( int dx = 0; dx < w; dx++ )
            {
                int sx = xofs[dx];
                short a0 = ialphap[0];
                short a1 = ialphap[1];

                const unsigned char* S1p = S1 + sx;
#if __ARM_NEON
                int16x4_t _a0 = vdup_n_s16(a0);
                int16x4_t _a1 = vdup_n_s16(a1);
                uint8x8_t _S1 = vld1_u8(S1p);
                int16x8_t _S116 = vreinterpretq_s16_u16(vmovl_u8(_S1));
                int16x4_t _S1low = vget_low_s16(_S116);
                int16x4_t _S1high = vget_high_s16(_S116);
                int32x4_t _rows1 = vmull_s16(_S1low, _a0);
                _rows1 = vmlal_s16(_rows1, _S1high, _a1);
                int16x4_t _rows1_sr4 = vshrn_n_s32(_rows1, 4);
                vst1_s16(rows1p, _rows1_sr4);
#else
                rows1p[0] = (S1p[0]*a0 + S1p[4]*a1) >> 4;
                rows1p[1] = (S1p[1]*a0 + S1p[5]*a1) >> 4;
                rows1p[2] = (S1p[2]*a0 + S1p[6]*a1) >> 4;
                rows1p[3] = (S1p[3]*a0 + S1p[7]*a1) >> 4;
#endif // __ARM_NEON

                ialphap += 2;
                rows1p += 4;
            }
        }
        else
        {
            // hresize two rows
            const unsigned char *S0 = src + srcstride * (sy);
            const unsigned char *S1 = src + srcstride * (sy+1);

            const short* ialphap = ialpha;
            short* rows0p = rows0;
            short* rows1p = rows1;
            for ( int dx = 0; dx < w; dx++ )
            {
                int sx = xofs[dx];
                short a0 = ialphap[0];
                short a1 = ialphap[1];

                const unsigned char* S0p = S0 + sx;
                const unsigned char* S1p = S1 + sx;
#if __ARM_NEON
                int16x4_t _a0 = vdup_n_s16(a0);
                int16x4_t _a1 = vdup_n_s16(a1);
                uint8x8_t _S0 = vld1_u8(S0p);
                uint8x8_t _S1 = vld1_u8(S1p);
                int16x8_t _S016 = vreinterpretq_s16_u16(vmovl_u8(_S0));
                int16x8_t _S116 = vreinterpretq_s16_u16(vmovl_u8(_S1));
                int16x4_t _S0low = vget_low_s16(_S016);
                int16x4_t _S1low = vget_low_s16(_S116);
                int16x4_t _S0high = vget_high_s16(_S016);
                int16x4_t _S1high = vget_high_s16(_S116);
                int32x4_t _rows0 = vmull_s16(_S0low, _a0);
                int32x4_t _rows1 = vmull_s16(_S1low, _a0);
                _rows0 = vmlal_s16(_rows0, _S0high, _a1);
                _rows1 = vmlal_s16(_rows1, _S1high, _a1);
                int16x4_t _rows0_sr4 = vshrn_n_s32(_rows0, 4);
                int16x4_t _rows1_sr4 = vshrn_n_s32(_rows1, 4);
                vst1_s16(rows0p, _rows0_sr4);
                vst1_s16(rows1p, _rows1_sr4);
#else
                rows0p[0] = (S0p[0]*a0 + S0p[4]*a1) >> 4;
                rows0p[1] = (S0p[1]*a0 + S0p[5]*a1) >> 4;
                rows0p[2] = (S0p[2]*a0 + S0p[6]*a1) >> 4;
                rows0p[3] = (S0p[3]*a0 + S0p[7]*a1) >> 4;
                rows1p[0] = (S1p[0]*a0 + S1p[4]*a1) >> 4;
                rows1p[1] = (S1p[1]*a0 + S1p[5]*a1) >> 4;
                rows1p[2] = (S1p[2]*a0 + S1p[6]*a1) >> 4;
                rows1p[3] = (S1p[3]*a0 + S1p[7]*a1) >> 4;
#endif // __ARM_NEON

                ialphap += 2;
                rows0p += 4;
                rows1p += 4;
            }
        }

        prev_sy1 = sy;

        // vresize
        short b0 = ibeta[0];
        short b1 = ibeta[1];

        short* rows0p = rows0;
        short* rows1p = rows1;
        unsigned char* Dp = dst + stride * (dy);

#if __ARM_NEON
        int nn = (w * 4) >> 3;
#else
        int nn = 0;
#endif
        int remain = (w * 4) - (nn << 3);

#if __ARM_NEON
#if __aarch64__
        int16x4_t _b0 = vdup_n_s16(b0);
        int16x4_t _b1 = vdup_n_s16(b1);
        int32x4_t _v2 = vdupq_n_s32(2);
        for (; nn>0; nn--)
        {
            int16x4_t _rows0p_sr4 = vld1_s16(rows0p);
            int16x4_t _rows1p_sr4 = vld1_s16(rows1p);
            int16x4_t _rows0p_1_sr4 = vld1_s16(rows0p+4);
            int16x4_t _rows1p_1_sr4 = vld1_s16(rows1p+4);

            int32x4_t _rows0p_sr4_mb0 = vmull_s16(_rows0p_sr4, _b0);
            int32x4_t _rows1p_sr4_mb1 = vmull_s16(_rows1p_sr4, _b1);
            int32x4_t _rows0p_1_sr4_mb0 = vmull_s16(_rows0p_1_sr4, _b0);
            int32x4_t _rows1p_1_sr4_mb1 = vmull_s16(_rows1p_1_sr4, _b1);

            int32x4_t _acc = _v2;
            _acc = vsraq_n_s32(_acc, _rows0p_sr4_mb0, 16);
            _acc = vsraq_n_s32(_acc, _rows1p_sr4_mb1, 16);

            int32x4_t _acc_1 = _v2;
            _acc_1 = vsraq_n_s32(_acc_1, _rows0p_1_sr4_mb0, 16);
            _acc_1 = vsraq_n_s32(_acc_1, _rows1p_1_sr4_mb1, 16);

            int16x4_t _acc16 = vshrn_n_s32(_acc, 2);
            int16x4_t _acc16_1 = vshrn_n_s32(_acc_1, 2);

            uint8x8_t _D = vqmovun_s16(vcombine_s16(_acc16, _acc16_1));

            vst1_u8(Dp, _D);

            Dp += 8;
            rows0p += 8;
            rows1p += 8;
        }
#else
        if (nn > 0)
        {
        asm volatile(
            "vdup.s16   d16, %8         \n"
            "mov        r4, #2          \n"
            "vdup.s16   d17, %9         \n"
            "vdup.s32   q12, r4         \n"
            "pld        [%0, #128]      \n"
            "vld1.s16   {d2-d3}, [%0 :128]!\n"
            "pld        [%1, #128]      \n"
            "vld1.s16   {d6-d7}, [%1 :128]!\n"
            "0:                         \n"
            "vmull.s16  q0, d2, d16     \n"
            "vmull.s16  q1, d3, d16     \n"
            "vorr.s32   q10, q12, q12   \n"
            "vorr.s32   q11, q12, q12   \n"
            "vmull.s16  q2, d6, d17     \n"
            "vmull.s16  q3, d7, d17     \n"
            "vsra.s32   q10, q0, #16    \n"
            "vsra.s32   q11, q1, #16    \n"
            "pld        [%0, #128]      \n"
            "vld1.s16   {d2-d3}, [%0 :128]!\n"
            "vsra.s32   q10, q2, #16    \n"
            "vsra.s32   q11, q3, #16    \n"
            "pld        [%1, #128]      \n"
            "vld1.s16   {d6-d7}, [%1 :128]!\n"
            "vshrn.s32  d20, q10, #2    \n"
            "vshrn.s32  d21, q11, #2    \n"
            "vqmovun.s16 d20, q10        \n"
            "vst1.8     {d20}, [%2]!    \n"
            "subs       %3, #1          \n"
            "bne        0b              \n"
            "sub        %0, #16         \n"
            "sub        %1, #16         \n"
            : "=r"(rows0p), // %0
              "=r"(rows1p), // %1
              "=r"(Dp),     // %2
              "=r"(nn)      // %3
            : "0"(rows0p),
              "1"(rows1p),
              "2"(Dp),
              "3"(nn),
              "r"(b0),      // %8
              "r"(b1)       // %9
            : "cc", "memory", "r4", "q0", "q1", "q2", "q3", "q8", "q9", "q10", "q11", "q12"
        );
        }
#endif // __aarch64__
#endif // __ARM_NEON
        for ( ; remain; --remain )
        {
//             D[x] = (rows0[x]*b0 + rows1[x]*b1) >> INTER_RESIZE_COEF_BITS;
            *Dp++ = (unsigned char)(( (short)((b0 * (short)(*rows0p++)) >> 16) + (short)((b1 * (short)(*rows1p++)) >> 16) + 2)>>2);
        }

        ibeta += 2;
    }

    delete[] buf;
}